

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

void __thiscall
chaiscript::detail::Loadable_Module::Loadable_Module
          (Loadable_Module *this,string *t_module_name,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  DLModule::DLModule(&this->m_dlmodule,t_filename);
  std::operator+(&local_30,"create_chaiscript_module_",t_module_name);
  DLSym<std::shared_ptr<chaiscript::Module>_(*)()>::DLSym(&this->m_func,&this->m_dlmodule,&local_30)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  (*(this->m_func).m_symbol)(&this->m_moduleptr);
  return;
}

Assistant:

Loadable_Module(const std::string &t_module_name, const std::string &t_filename)
        : m_dlmodule(t_filename), m_func(m_dlmodule, "create_chaiscript_module_" + t_module_name),
        m_moduleptr(m_func.m_symbol())
      {
      }